

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

Value * __thiscall toml::internal::Parser::parseGroupKey(Parser *this,Value *root)

{
  bool bVar1;
  TokenType TVar2;
  Token *pTVar3;
  string *psVar4;
  size_t sVar5;
  Parser *in_RSI;
  Parser *in_RDI;
  Value *candidate_1;
  Value *candidate;
  string key;
  Value *currentValue;
  bool isArray;
  undefined4 in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd5c;
  int iVar6;
  Parser *in_stack_fffffffffffffd60;
  Parser *in_stack_fffffffffffffd68;
  Value *in_stack_fffffffffffffd70;
  Parser *in_stack_fffffffffffffd78;
  Parser *in_stack_fffffffffffffd80;
  Parser *in_stack_fffffffffffffd98;
  Parser *in_stack_fffffffffffffda0;
  Value *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  Value local_1a8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  Parser local_128;
  Parser *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  int local_64;
  Parser *local_60;
  string local_48 [32];
  Parser *local_28;
  byte local_19;
  Parser *local_18;
  Parser *local_8;
  
  local_18 = in_RSI;
  bVar1 = consumeForKey(in_stack_fffffffffffffd68,
                        (TokenType)((ulong)in_stack_fffffffffffffd60 >> 0x20));
  if (bVar1) {
    local_19 = 0;
    pTVar3 = token(in_RDI);
    TVar2 = Token::type(pTVar3);
    if (TVar2 == LBRACKET) {
      nextKey(in_stack_fffffffffffffda0);
      local_19 = 1;
    }
    local_28 = local_18;
    do {
      pTVar3 = token(in_RDI);
      TVar2 = Token::type(pTVar3);
      if (TVar2 != IDENT) {
        pTVar3 = token(in_RDI);
        TVar2 = Token::type(pTVar3);
        if (TVar2 != STRING) {
          return (Value *)0x0;
        }
      }
      pTVar3 = token(in_RDI);
      psVar4 = Token::strValue_abi_cxx11_(pTVar3);
      std::__cxx11::string::string(local_48,(string *)psVar4);
      nextKey(in_stack_fffffffffffffda0);
      pTVar3 = token(in_RDI);
      TVar2 = Token::type(pTVar3);
      if (TVar2 == DOT) {
        nextKey(in_stack_fffffffffffffda0);
        local_60 = (Parser *)
                   Value::findChild((Value *)in_stack_fffffffffffffd78,
                                    (string *)in_stack_fffffffffffffd70);
        if (local_60 == (Parser *)0x0) {
          local_88 = 0;
          uStack_80 = 0;
          local_98 = 0;
          uStack_90 = 0;
          local_a8 = 0;
          uStack_a0 = 0;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                 *)0x1827ac);
          Value::Value(in_stack_fffffffffffffd70,(Table *)in_stack_fffffffffffffd68);
          local_28 = (Parser *)
                     Value::setChild((Value *)CONCAT17(in_stack_fffffffffffffdd7,
                                                       in_stack_fffffffffffffdd0),
                                     in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
          Value::~Value((Value *)in_stack_fffffffffffffd80);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                  *)0x182814);
        }
        else {
          bVar1 = Value::is<std::vector<toml::Value,std::allocator<toml::Value>>>
                            ((Value *)in_stack_fffffffffffffd60);
          if ((bVar1) && (sVar5 = Value::size((Value *)in_stack_fffffffffffffd68), sVar5 != 0)) {
            Value::size((Value *)in_stack_fffffffffffffd68);
            local_60 = (Parser *)
                       Value::find((Value *)in_stack_fffffffffffffd60,
                                   CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
          }
          bVar1 = Value::
                  is<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                            ((Value *)in_stack_fffffffffffffd60);
          if (!bVar1) {
            local_8 = (Parser *)0x0;
            local_64 = 1;
            goto LAB_00182da7;
          }
          local_28 = local_60;
        }
        local_64 = 2;
      }
      else {
        pTVar3 = token(in_RDI);
        TVar2 = Token::type(pTVar3);
        if (TVar2 == RBRACKET) {
          nextKey(in_stack_fffffffffffffda0);
          local_b0 = (Parser *)
                     Value::findChild((Value *)in_stack_fffffffffffffd78,
                                      (string *)in_stack_fffffffffffffd70);
          if (local_b0 == (Parser *)0x0) {
            if ((local_19 & 1) == 0) {
              local_188 = 0;
              uStack_180 = 0;
              local_198 = 0;
              uStack_190 = 0;
              local_1a8.type_ = NULL_TYPE;
              local_1a8._4_4_ = 0;
              local_1a8.field_1.null_ = (void *)0x0;
              in_stack_fffffffffffffd70 = &local_1a8;
              in_stack_fffffffffffffd68 = local_28;
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
              ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                     *)0x182cdd);
              Value::Value(in_stack_fffffffffffffd70,(Table *)in_stack_fffffffffffffd68);
              in_stack_fffffffffffffd60 =
                   (Parser *)
                   Value::setChild((Value *)CONCAT17(in_stack_fffffffffffffdd7,
                                                     in_stack_fffffffffffffdd0),
                                   in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
              local_28 = in_stack_fffffffffffffd60;
              Value::~Value((Value *)in_stack_fffffffffffffd80);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
              ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                      *)0x182d39);
            }
            else {
              local_128.lexer_.is_ = (istream *)0x0;
              local_128.lexer_.lineNo_ = 0;
              local_128.lexer_._12_4_ = 0;
              local_128.token_.type_ = ERROR_TOKEN;
              local_128.token_._4_4_ = 0;
              in_stack_fffffffffffffda0 = &local_128;
              in_stack_fffffffffffffd98 = local_28;
              std::vector<toml::Value,_std::allocator<toml::Value>_>::vector
                        ((vector<toml::Value,_std::allocator<toml::Value>_> *)0x182b22);
              Value::Value(in_stack_fffffffffffffd70,(Array *)in_stack_fffffffffffffd68);
              local_28 = (Parser *)
                         Value::setChild((Value *)CONCAT17(in_stack_fffffffffffffdd7,
                                                           in_stack_fffffffffffffdd0),
                                         in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
              Value::~Value((Value *)in_stack_fffffffffffffd80);
              std::vector<toml::Value,_std::allocator<toml::Value>_>::~vector
                        ((vector<toml::Value,_std::allocator<toml::Value>_> *)
                         in_stack_fffffffffffffd70);
              local_148 = 0;
              uStack_140 = 0;
              local_158 = 0;
              uStack_150 = 0;
              local_168 = 0;
              uStack_160 = 0;
              in_stack_fffffffffffffd80 = local_28;
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
              ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                     *)0x182bb8);
              Value::Value(in_stack_fffffffffffffd70,(Table *)in_stack_fffffffffffffd68);
              in_stack_fffffffffffffd78 =
                   (Parser *)
                   Value::push((Value *)in_stack_fffffffffffffda0,(Value *)in_stack_fffffffffffffd98
                              );
              local_28 = in_stack_fffffffffffffd78;
              Value::~Value((Value *)in_stack_fffffffffffffd80);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
              ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                      *)0x182c0c);
            }
LAB_00182d83:
            local_64 = 3;
          }
          else if ((local_19 & 1) == 0) {
            in_stack_fffffffffffffdd7 =
                 Value::is<std::vector<toml::Value,std::allocator<toml::Value>>>
                           ((Value *)in_stack_fffffffffffffd60);
            if (((bool)in_stack_fffffffffffffdd7) &&
               (in_stack_fffffffffffffdc8 =
                     (string *)Value::size((Value *)in_stack_fffffffffffffd68),
               in_stack_fffffffffffffdc8 != (string *)0x0)) {
              in_stack_fffffffffffffdc0 = (Value *)Value::size((Value *)in_stack_fffffffffffffd68);
              local_b0 = (Parser *)
                         Value::find((Value *)in_stack_fffffffffffffd60,
                                     CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
            }
            bVar1 = Value::
                    is<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                              ((Value *)in_stack_fffffffffffffd60);
            if (bVar1) {
              local_28 = local_b0;
              goto LAB_00182d83;
            }
            local_8 = (Parser *)0x0;
            local_64 = 1;
          }
          else {
            bVar1 = Value::is<std::vector<toml::Value,std::allocator<toml::Value>>>
                              ((Value *)in_stack_fffffffffffffd60);
            if (bVar1) {
              local_128.errorReason_ = (string)0x0;
              local_128._81_7_ = 0;
              local_128._88_8_ = 0;
              local_128.token_.double_value_ = 0.0;
              local_128.token_.time_value_.__d.__r = (duration)0;
              local_128.token_._32_8_ = 0;
              local_128.token_.int_value_ = 0;
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
              ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                     *)0x182967);
              Value::Value(in_stack_fffffffffffffd70,(Table *)in_stack_fffffffffffffd68);
              local_28 = (Parser *)
                         Value::push((Value *)in_stack_fffffffffffffda0,
                                     (Value *)in_stack_fffffffffffffd98);
              Value::~Value((Value *)in_stack_fffffffffffffd80);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
              ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                      *)0x1829c7);
              goto LAB_00182d83;
            }
            local_8 = (Parser *)0x0;
            local_64 = 1;
          }
        }
        else {
          local_8 = (Parser *)0x0;
          local_64 = 1;
        }
      }
LAB_00182da7:
      std::__cxx11::string::~string(local_48);
      if (local_64 == 1) {
        return (Value *)local_8;
      }
      in_stack_fffffffffffffd5c = local_64;
    } while (local_64 == 2);
    iVar6 = local_64;
    if (((local_19 & 1) == 0) ||
       (bVar1 = consumeForKey(in_stack_fffffffffffffd68,
                              (TokenType)((ulong)in_stack_fffffffffffffd60 >> 0x20)), bVar1)) {
      bVar1 = consumeEOLorEOFForKey((Parser *)CONCAT44(iVar6,in_stack_fffffffffffffd58));
      if (bVar1) {
        local_8 = local_28;
      }
      else {
        local_8 = (Parser *)0x0;
      }
    }
    else {
      local_8 = (Parser *)0x0;
    }
  }
  else {
    local_8 = (Parser *)0x0;
  }
  return (Value *)local_8;
}

Assistant:

inline Value* Parser::parseGroupKey(Value* root)
{
    if (!consumeForKey(TokenType::LBRACKET))
        return nullptr;

    bool isArray = false;
    if (token().type() == TokenType::LBRACKET) {
        nextKey();
        isArray = true;
    }

    Value* currentValue = root;
    while (true) {
        if (token().type() != TokenType::IDENT && token().type() != TokenType::STRING)
            return nullptr;

        std::string key = token().strValue();
        nextKey();

        if (token().type() == TokenType::DOT) {
            nextKey();
            if (Value* candidate = currentValue->findChild(key)) {
                if (candidate->is<Array>() && candidate->size() > 0)
                    candidate = candidate->find(candidate->size() - 1);
                if (!candidate->is<Table>())
                    return nullptr;
                currentValue = candidate;
            } else {
                currentValue = currentValue->setChild(key, Table());
            }
            continue;
        }

        if (token().type() == TokenType::RBRACKET) {
            nextKey();
            if (Value* candidate = currentValue->findChild(key)) {
                if (isArray) {
                    if (!candidate->is<Array>())
                        return nullptr;
                    currentValue = candidate->push(Table());
                } else {
                    if (candidate->is<Array>() && candidate->size() > 0)
                        candidate = candidate->find(candidate->size() - 1);
                    if (!candidate->is<Table>())
                        return nullptr;
                    currentValue = candidate;
                }
            } else {
                if (isArray) {
                    currentValue = currentValue->setChild(key, Array());
                    currentValue = currentValue->push(Table());
                } else {
                    currentValue = currentValue->setChild(key, Table());
                }
            }
            break;
        }

        return nullptr;
    }

    if (isArray) {
        if (!consumeForKey(TokenType::RBRACKET))
            return nullptr;
    }

    if (!consumeEOLorEOFForKey())
        return nullptr;

    return currentValue;
}